

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedExplicitZeroTest_Test::TestBody
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedExplicitZeroTest_Test *this)

{
  allocator<const_google::protobuf::FieldDescriptor_*> *this_00;
  Reflection *pRVar1;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  bool bVar2;
  char *pcVar3;
  int *piVar4;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  *matcher;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  *matcher_00;
  TestAllTypes *this_01;
  initializer_list<int> rhs;
  initializer_list<int> rhs_00;
  AssertHelper local_298;
  Message local_290;
  char local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_7;
  Message local_268;
  undefined4 local_25c;
  Eq2Matcher *local_258;
  undefined8 local_250;
  testing local_241;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  local_240;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_6;
  Message local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  FieldDescriptor *local_198;
  iterator local_190;
  size_type local_188;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_180;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  Eq2Matcher *local_150;
  undefined8 local_148;
  testing local_139;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  local_138;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  char local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  int local_88;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator<const_google::protobuf::FieldDescriptor_*> local_59;
  FieldDescriptor *local_58;
  iterator local_50;
  size_type local_48;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_40;
  string_view local_28;
  FieldDescriptor *local_18;
  FieldDescriptor *f;
  NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedExplicitZeroTest_Test *this_local;
  
  this_01 = &(this->super_NoFieldPresenceSwapFieldTest).m1_;
  f = (FieldDescriptor *)this;
  proto2_nofieldpresence_unittest::TestAllTypes::add_repeated_int32(this_01,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"repeated_int32");
  local_58 = NoFieldPresenceSwapFieldTest::FindFieldByName
                       (&this->super_NoFieldPresenceSwapFieldTest,local_28);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  local_50 = &local_58;
  local_48 = 1;
  local_18 = local_58;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_59);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_40,__l_00,&local_59);
  Reflection::SwapFields
            (pRVar1,&this_01->super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_40);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_40);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_59);
  local_84 = Reflection::FieldSize
                       ((this->super_NoFieldPresenceSwapFieldTest).r1_,
                        &(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,local_18);
  local_88 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_80,"r1_->FieldSize(m1_, f)","0",&local_84,&local_88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ac = Reflection::FieldSize
                       ((this->super_NoFieldPresenceSwapFieldTest).r2_,
                        &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,local_18);
  local_b0 = 1;
  piVar4 = &local_b0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a8,"r2_->FieldSize(m2_, f)","1",&local_ac,piVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f8,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  testing::IsEmpty();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>
            ();
  proto2_nofieldpresence_unittest::TestAllTypes::repeated_int32
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_d0,&local_d1,(RepeatedField<int> *)"m1_.repeated_int32()");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f9,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::Eq();
  local_154 = 0;
  local_150 = (Eq2Matcher *)&local_154;
  local_148 = 1;
  rhs._M_len = (size_type)piVar4;
  rhs._M_array = (iterator)0x1;
  testing::UnorderedPointwise<testing::internal::Eq2Matcher,int>
            (&local_138,&local_139,local_150,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
            (&local_118,(internal *)&local_138,matcher);
  proto2_nofieldpresence_unittest::TestAllTypes::repeated_int32
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
  ::operator()(local_f8,(char *)&local_118,(RepeatedField<int> *)"m2_.repeated_int32()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_118);
  testing::internal::
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  ::~UnorderedElementsAreArrayMatcher(&local_138);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  local_198 = local_18;
  local_190 = &local_198;
  local_188 = 1;
  this_00 = (allocator<const_google::protobuf::FieldDescriptor_*> *)
            ((long)&gtest_ar_4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(this_00);
  __l._M_len = local_188;
  __l._M_array = local_190;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_180,__l,this_00);
  Reflection::SwapFields
            (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_180);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_180);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1b4 = Reflection::FieldSize
                        ((this->super_NoFieldPresenceSwapFieldTest).r1_,
                         &(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,local_18);
  local_1b8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b0,"r1_->FieldSize(m1_, f)","1",&local_1b4,&local_1b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x201,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1dc = Reflection::FieldSize
                        ((this->super_NoFieldPresenceSwapFieldTest).r2_,
                         &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,local_18);
  local_1e0 = 0;
  piVar4 = &local_1e0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d8,"r2_->FieldSize(m2_, f)","0",&local_1dc,piVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    piVar4 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x202,(char *)piVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  testing::Eq();
  local_25c = 0;
  local_258 = (Eq2Matcher *)&local_25c;
  local_250 = 1;
  rhs_00._M_len = (size_type)piVar4;
  rhs_00._M_array = (iterator)0x1;
  testing::UnorderedPointwise<testing::internal::Eq2Matcher,int>
            (&local_240,&local_241,local_258,rhs_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
            (&local_220,(internal *)&local_240,matcher_00);
  proto2_nofieldpresence_unittest::TestAllTypes::repeated_int32
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
  ::operator()(local_200,(char *)&local_220,(RepeatedField<int> *)"m1_.repeated_int32()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_220);
  testing::internal::
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  ::~UnorderedElementsAreArrayMatcher(&local_240);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x203,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::IsEmpty();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>
            ();
  proto2_nofieldpresence_unittest::TestAllTypes::repeated_int32
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_280,&local_281,(RepeatedField<int> *)"m2_.repeated_int32()");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest,
       ReflectionSwapFieldRepeatedExplicitZeroTest) {
  // For repeated fields, explicitly adding zero would cause it to be added into
  // the repeated field.
  m1_.add_repeated_int32(0);

  const FieldDescriptor* f = FindFieldByName("repeated_int32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 0);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 1);
  EXPECT_THAT(m1_.repeated_int32(), IsEmpty());
  EXPECT_THAT(m2_.repeated_int32(), UnorderedPointwise(Eq(), {0}));

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped again.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 1);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 0);
  EXPECT_THAT(m1_.repeated_int32(), UnorderedPointwise(Eq(), {0}));
  EXPECT_THAT(m2_.repeated_int32(), IsEmpty());
}